

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::recalc_share_mode(torrent *this)

{
  peer_connection *ppVar1;
  span<libtorrent::aux::peer_connection_*> sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  vector<peer_connection_*> *pvVar8;
  reference pppVar9;
  pointer ppVar10;
  int *piVar11;
  long lVar12;
  session_settings *psVar13;
  value_type *pvVar14;
  piece_stats_t pVar15;
  bool was_finished;
  int pick;
  int local_15c;
  int iStack_158;
  piece_stats_t ps;
  int local_148;
  piece_index_t i;
  int rarest_rarity;
  int num_pieces;
  vector<piece_index_t> rarest_pieces;
  piece_count local_110;
  int local_f8;
  undefined1 local_f1;
  int num_downloaded_pieces;
  peer_connection **local_e0;
  peer_connection **p_1;
  peer_connection **__end3;
  peer_connection **__begin3;
  span<libtorrent::aux::peer_connection_*> local_b8;
  span<libtorrent::aux::peer_connection_*> *local_a8;
  span<libtorrent::aux::peer_connection_*> *__range3;
  container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  *local_90;
  peer_connection **local_88;
  peer_connection **local_80;
  undefined1 local_68 [8];
  vector<peer_connection_*> seeds;
  int to_disconnect;
  peer_connection *p;
  iterator __end2;
  iterator __begin2;
  vector<peer_connection_*> *__range2;
  int local_20;
  int missing_pieces;
  int num_downloaders;
  int num_peers;
  int num_seeds;
  int pieces_in_torrent;
  torrent *this_local;
  
  bVar3 = is_seed(this);
  if (!bVar3) {
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar4 = torrent_info::num_pieces(peVar7);
    num_downloaders = 0;
    missing_pieces = 0;
    local_20 = 0;
    __range2._4_4_ = 0;
    pvVar8 = &(this->super_torrent_hot_members).m_connections;
    __end2 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin(&pvVar8->
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    );
    p = (peer_connection *)
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::end(&pvVar8->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             );
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                  *)&p);
      sVar2.m_len = local_b8.m_len;
      sVar2.m_ptr = local_b8.m_ptr;
      if (!bVar3) break;
      pppVar9 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&__end2);
      ppVar1 = *pppVar9;
      bVar3 = peer_connection::is_connecting(ppVar1);
      if ((!bVar3) &&
         (uVar6 = (*(ppVar1->super_bandwidth_socket)._vptr_bandwidth_socket[1])(), (uVar6 & 1) == 0)
         ) {
        missing_pieces = missing_pieces + 1;
        bVar3 = peer_connection::is_seed(ppVar1);
        if (bVar3) {
          num_downloaders = num_downloaders + 1;
        }
        else {
          bVar3 = peer_connection::share_mode(ppVar1);
          if ((!bVar3) && (bVar3 = peer_connection::upload_only(ppVar1), !bVar3)) {
            local_20 = local_20 + 1;
            iVar5 = peer_connection::num_have_pieces(ppVar1);
            __range2._4_4_ = (iVar4 - iVar5) + __range2._4_4_;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end2);
    }
    if (missing_pieces != 0) {
      if ((0x32 < (num_downloaders * 100) / missing_pieces) &&
         ((0x5a < (missing_pieces * 100) /
                  (int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                              >> 0x21) & 0xffffff) || (local_b8 = sVar2, 0x14 < missing_pieces)))) {
        seeds.
        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        .
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             num_downloaders - missing_pieces / 2;
        container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
        ::container_wrapper((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                             *)local_68);
        container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
        ::reserve<int,void>((container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
                             *)local_68,num_downloaders);
        pvVar8 = &(this->super_torrent_hot_members).m_connections;
        local_80 = (peer_connection **)
                   ::std::
                   vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ::begin(&pvVar8->
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          );
        local_88 = (peer_connection **)
                   ::std::
                   vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ::end(&pvVar8->
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        );
        local_90 = (container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    *)::std::
                      back_inserter<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>>
                                ((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                  *)local_68);
        __range3 = (span<libtorrent::aux::peer_connection_*> *)
                   ::std::
                   copy_if<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,std::back_insert_iterator<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>>,libtorrent::aux::torrent::recalc_share_mode()::__0>
                             (local_80,local_88,local_90);
        random_shuffle<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>>
                  ((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    *)local_68);
        span<libtorrent::aux::peer_connection*>::
        span<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,libtorrent::aux::peer_connection*,void>
                  ((span<libtorrent::aux::peer_connection*> *)&__begin3,
                   (container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    *)local_68);
        local_b8 = span<libtorrent::aux::peer_connection_*>::first
                             ((span<libtorrent::aux::peer_connection_*> *)&__begin3,
                              (long)seeds.
                                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    .
                                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        local_a8 = &local_b8;
        __end3 = span<libtorrent::aux::peer_connection_*>::begin(local_a8);
        p_1 = span<libtorrent::aux::peer_connection_*>::end(local_a8);
        for (; __end3 != p_1; __end3 = __end3 + 1) {
          local_e0 = __end3;
          ppVar1 = *__end3;
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&num_downloaded_pieces,upload_upload_connection,(type *)0x0);
          local_f1 = 0;
          (*(ppVar1->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                    (ppVar1,(error_code *)&num_downloaded_pieces,1,0);
        }
        container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
        ::~container_wrapper
                  ((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    *)local_68);
      }
      if ((local_20 != 0) && (0 < __range2._4_4_ + num_downloaders * -2)) {
        ppVar10 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        piece_picker::have(&local_110,ppVar10);
        ppVar10 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        piece_picker::want((piece_count *)
                           &rarest_pieces.
                            super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                            .
                            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar10);
        piVar11 = ::std::max<int>(&local_110.num_pieces,
                                  (int *)&rarest_pieces.
                                          super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                          .
                                          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_f8 = *piVar11;
        lVar12 = (long)local_f8;
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        iVar4 = torrent_info::piece_length(peVar7);
        psVar13 = settings(this);
        iVar5 = session_settings::get_int(psVar13,0x404d);
        lVar12 = lVar12 * iVar4 * (long)iVar5;
        if ((lVar12 - this->m_total_uploaded == 0 || lVar12 < this->m_total_uploaded) ||
           (local_f8 < 1)) {
          ppVar10 = ::std::
                    unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                    ::operator->(&(this->super_torrent_hot_members).m_picker);
          iVar4 = piece_picker::get_download_queue_size(ppVar10);
          if (iVar4 <= local_f8 / 0x14) {
            container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
            ::container_wrapper((container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                 *)&rarest_rarity);
            peVar7 = ::std::
                     __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(this->super_torrent_hot_members).m_torrent_file);
            iVar4 = torrent_info::num_pieces(peVar7);
            local_148 = 0x7fffffff;
            memset(&ps.have,0,4);
            while( true ) {
              strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&ps.priority
                         ,iVar4);
              bVar3 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                                ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                 &ps.have,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>
                                           *)&ps.priority);
              if (!bVar3) break;
              ppVar10 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              pVar15 = piece_picker::piece_stats(ppVar10,(piece_index_t)ps._8_4_);
              ps.peer_count = pVar15._8_4_;
              local_15c = pVar15.peer_count;
              if (local_15c != 0) {
                iStack_158 = pVar15.priority;
                if ((iStack_158 == 0) &&
                   ((((undefined1  [12])pVar15 & (undefined1  [12])0x1) != (undefined1  [12])0x0 ||
                    (((undefined1  [12])pVar15 & (undefined1  [12])0x100) != (undefined1  [12])0x0))
                   )) {
                  ppVar10 = ::std::
                            unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ::operator->(&(this->super_torrent_hot_members).m_picker);
                  piece_picker::set_piece_priority
                            (ppVar10,(piece_index_t)ps._8_4_,(download_priority_t)0x4);
                }
                else if ((iStack_158 < 1) &&
                        ((((undefined1  [12])pVar15 & (undefined1  [12])0x1) ==
                          (undefined1  [12])0x0 && (local_15c <= local_148)))) {
                  if (local_15c == local_148) {
                    ::std::
                    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    ::push_back((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                 *)&rarest_rarity,(value_type *)&ps.have);
                  }
                  else {
                    ::std::
                    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    ::clear((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                             *)&rarest_rarity);
                    local_148 = local_15c;
                    ::std::
                    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    ::push_back((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                 *)&rarest_rarity,(value_type *)&ps.have);
                  }
                }
              }
              strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&ps.have);
            }
            update_gauge(this);
            update_want_peers(this);
            psVar13 = settings(this);
            iVar4 = session_settings::get_int(psVar13,0x404d);
            if (iVar4 <= missing_pieces - local_148) {
              iVar4 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                      ::end_index((container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                   *)&rarest_rarity);
              uVar6 = numeric_cast<unsigned_int,int,void>(iVar4 + -1);
              lVar12 = random((aux *)(ulong)uVar6);
              bVar3 = is_finished(this);
              ppVar10 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              pvVar14 = container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                        ::operator[]((container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                      *)&rarest_rarity,(int)lVar12);
              piece_picker::set_piece_priority
                        (ppVar10,(piece_index_t)pvVar14->m_val,(download_priority_t)0x4);
              update_gauge(this);
              update_peer_interest(this,bVar3);
              update_want_peers(this);
            }
            container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
            ::~container_wrapper
                      ((container_wrapper<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_int,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                        *)&rarest_rarity);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::recalc_share_mode()
	{
		TORRENT_ASSERT(share_mode());
		if (is_seed()) return;

		int const pieces_in_torrent = m_torrent_file->num_pieces();
		int num_seeds = 0;
		int num_peers = 0;
		int num_downloaders = 0;
		int missing_pieces = 0;
		for (auto const* const p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			if (p->is_connecting()) continue;
			if (p->is_disconnecting()) continue;
			++num_peers;
			if (p->is_seed())
			{
				++num_seeds;
				continue;
			}

			if (p->share_mode()) continue;
			if (p->upload_only()) continue;

			++num_downloaders;
			missing_pieces += pieces_in_torrent - p->num_have_pieces();
		}

		if (num_peers == 0) return;

		if (num_seeds * 100 / num_peers > 50
			&& (num_peers * 100 / m_max_connections > 90
				|| num_peers > 20))
		{
			// we are connected to more than 50% seeds (and we're beyond
			// 90% of the max number of connections). That will
			// limit our ability to upload. We need more downloaders.
			// disconnect some seeds so that we don't have more than 50%
			int const to_disconnect = num_seeds - num_peers / 2;
			aux::vector<peer_connection*> seeds;
			seeds.reserve(num_seeds);
			std::copy_if(m_connections.begin(), m_connections.end(), std::back_inserter(seeds)
				, [](peer_connection const* p) { return p->is_seed(); });

			aux::random_shuffle(seeds);
			TORRENT_ASSERT(to_disconnect <= seeds.end_index());
			for (auto const& p : span<peer_connection*>(seeds).first(to_disconnect))
				p->disconnect(errors::upload_upload_connection, operation_t::bittorrent);
		}

		if (num_downloaders == 0) return;

		// assume that the seeds are about as fast as us. During the time
		// we can download one piece, and upload one piece, each seed
		// can upload two pieces.
		missing_pieces -= 2 * num_seeds;

		if (missing_pieces <= 0) return;

		// missing_pieces represents our opportunity to download pieces
		// and share them more than once each

		// now, download at least one piece, otherwise download one more
		// piece if our downloaded (and downloading) pieces is less than 50%
		// of the uploaded bytes
		int const num_downloaded_pieces = std::max(m_picker->have().num_pieces
			, m_picker->want().num_pieces);

		if (std::int64_t(num_downloaded_pieces) * m_torrent_file->piece_length()
			* settings().get_int(settings_pack::share_mode_target) > m_total_uploaded
			&& num_downloaded_pieces > 0)
			return;

		// don't have more pieces downloading in parallel than 5% of the total
		// number of pieces we have downloaded
		if (m_picker->get_download_queue_size() > num_downloaded_pieces / 20)
			return;

		// one more important property is that there are enough pieces
		// that more than one peer wants to download
		// make sure that there are enough downloaders for the rarest
		// piece. Go through all pieces, figure out which one is the rarest
		// and how many peers that has that piece

		aux::vector<piece_index_t> rarest_pieces;

		int const num_pieces = m_torrent_file->num_pieces();
		int rarest_rarity = INT_MAX;
		for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
		{
			piece_picker::piece_stats_t ps = m_picker->piece_stats(i);
			if (ps.peer_count == 0) continue;
			if (ps.priority == 0 && (ps.have || ps.downloading))
			{
				m_picker->set_piece_priority(i, default_priority);
				continue;
			}
			// don't count pieces we already have or are trying to download
			if (ps.priority > 0 || ps.have) continue;
			if (ps.peer_count > rarest_rarity) continue;
			if (ps.peer_count == rarest_rarity)
			{
				rarest_pieces.push_back(i);
				continue;
			}

			rarest_pieces.clear();
			rarest_rarity = ps.peer_count;
			rarest_pieces.push_back(i);
		}

		update_gauge();
		update_want_peers();

		// now, rarest_pieces is a list of all pieces that are the rarest ones.
		// and rarest_rarity is the number of peers that have the rarest pieces

		// if there's only a single peer that doesn't have the rarest piece
		// it's impossible for us to download one piece and upload it
		// twice. i.e. we cannot get a positive share ratio
		if (num_peers - rarest_rarity
			< settings().get_int(settings_pack::share_mode_target))
			return;

		// now, pick one of the rarest pieces to download
		int const pick = int(random(aux::numeric_cast<std::uint32_t>(rarest_pieces.end_index() - 1)));
		bool const was_finished = is_finished();
		m_picker->set_piece_priority(rarest_pieces[pick], default_priority);
		update_gauge();
		update_peer_interest(was_finished);
		update_want_peers();
	}